

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

void Abc_NtkPartitionCompact(Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsAll,int nSuppSizeLimit)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p;
  int local_48;
  int local_44;
  int iPart;
  int i;
  Vec_Int_t *vTemp;
  Vec_Int_t *vPartSupp;
  Vec_Int_t *vPart;
  Vec_Int_t *vOne;
  int nSuppSizeLimit_local;
  Vec_Ptr_t *vPartSuppsAll_local;
  Vec_Ptr_t *vPartsAll_local;
  
  vOne._4_4_ = nSuppSizeLimit;
  if (nSuppSizeLimit == 0) {
    vOne._4_4_ = 200;
  }
  local_48 = 0;
  vTemp = (Vec_Int_t *)0x0;
  vPartSupp = (Vec_Int_t *)0x0;
  local_44 = 0;
  do {
    iVar1 = Vec_PtrSize(vPartSuppsAll);
    if (iVar1 <= local_44) {
      if (vPartSupp != (Vec_Int_t *)0x0) {
        Vec_PtrWriteEntry(vPartsAll,local_48,vPartSupp);
        if (vTemp == (Vec_Int_t *)0x0) {
          __assert_fail("vPartSupp != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcPart.c"
                        ,0x2bd,"void Abc_NtkPartitionCompact(Vec_Ptr_t *, Vec_Ptr_t *, int)");
        }
        pVVar2 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll,local_48);
        Vec_IntFree(pVVar2);
        Vec_PtrWriteEntry(vPartSuppsAll,local_48,vTemp);
        local_48 = local_48 + 1;
      }
      Vec_PtrShrink(vPartsAll,local_48);
      Vec_PtrShrink(vPartsAll,local_48);
      return;
    }
    pVVar2 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll,local_44);
    iVar1 = Vec_IntSize(pVVar2);
    if (iVar1 < vOne._4_4_) {
      if (vTemp == (Vec_Int_t *)0x0) {
        if (vPartSupp != (Vec_Int_t *)0x0) {
          __assert_fail("vPart == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcPart.c"
                        ,0x29b,"void Abc_NtkPartitionCompact(Vec_Ptr_t *, Vec_Ptr_t *, int)");
        }
        vTemp = Vec_IntDup(pVVar2);
        vPartSupp = (Vec_Int_t *)Vec_PtrEntry(vPartsAll,local_44);
      }
      else {
        pVVar2 = Vec_IntTwoMerge(vTemp,pVVar2);
        Vec_IntFree(vTemp);
        pVVar3 = (Vec_Int_t *)Vec_PtrEntry(vPartsAll,local_44);
        pVVar3 = Vec_IntTwoMerge(vPartSupp,pVVar3);
        Vec_IntFree(vPartSupp);
        p = (Vec_Int_t *)Vec_PtrEntry(vPartsAll,local_44);
        Vec_IntFree(p);
        vTemp = pVVar2;
        vPartSupp = pVVar3;
      }
      iVar1 = Vec_IntSize(vTemp);
      if (vOne._4_4_ <= iVar1) goto LAB_00338da1;
    }
    else {
      vPartSupp = (Vec_Int_t *)Vec_PtrEntry(vPartsAll,local_44);
LAB_00338da1:
      Vec_PtrWriteEntry(vPartsAll,local_48,vPartSupp);
      vPartSupp = (Vec_Int_t *)0x0;
      if (vTemp != (Vec_Int_t *)0x0) {
        pVVar2 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll,local_48);
        Vec_IntFree(pVVar2);
        Vec_PtrWriteEntry(vPartSuppsAll,local_48,vTemp);
        vTemp = (Vec_Int_t *)0x0;
      }
      local_48 = local_48 + 1;
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void Abc_NtkPartitionCompact( Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsAll, int nSuppSizeLimit )
{
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart;

    if ( nSuppSizeLimit == 0 )
        nSuppSizeLimit = 200;

    // pack smaller partitions into larger blocks
    iPart = 0;
    vPart = vPartSupp = NULL;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
    {
        if ( Vec_IntSize(vOne) < nSuppSizeLimit )
        {
            if ( vPartSupp == NULL )
            {
                assert( vPart == NULL );
                vPartSupp = Vec_IntDup(vOne);
                vPart = (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i);
            }
            else
            {
                vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
                Vec_IntFree( vTemp );
                vPart = Vec_IntTwoMerge( vTemp = vPart, (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i) );
                Vec_IntFree( vTemp );
                Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i) );
            }
            if ( Vec_IntSize(vPartSupp) < nSuppSizeLimit )
                continue;
        }
        else
            vPart = (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i);
        // add the partition 
        Vec_PtrWriteEntry( vPartsAll, iPart, vPart );  
        vPart = NULL;
        if ( vPartSupp ) 
        {
            Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll, iPart) );
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );  
            vPartSupp = NULL;
        }
        iPart++;
    }
    // add the last one
    if ( vPart )
    {
        Vec_PtrWriteEntry( vPartsAll, iPart, vPart );  
        vPart = NULL;

        assert( vPartSupp != NULL );
        Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll, iPart) );
        Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );  
        vPartSupp = NULL;
        iPart++;
    }
    Vec_PtrShrink( vPartsAll, iPart );
    Vec_PtrShrink( vPartsAll, iPart );
}